

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endec_pair_tester.hxx
# Opt level: O1

void __thiscall
cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_bf_cfb64>>::
check_roundtrip<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (endec_pair_tester<cryptox::symmetric_algorithm<&EVP_bf_cfb64>> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source)

{
  size_t local_188;
  size_t local_180;
  size_t *local_178;
  undefined1 *local_170;
  buffer_type plaintext;
  buffer_type ciphertext;
  assertion_result local_128;
  size_t **local_110;
  undefined1 local_108 [8];
  undefined8 local_100;
  shared_count sStack_f8;
  undefined **local_f0;
  undefined1 local_e8;
  undefined8 *local_e0;
  char *local_d8;
  undefined **local_d0;
  undefined1 local_c8;
  undefined8 *local_c0;
  undefined1 **local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  basic_endec<cryptox::symmetric_algorithm<&EVP_bf_cfb64>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
  ::operator()((basic_endec<cryptox::symmetric_algorithm<&EVP_bf_cfb64>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
                *)(this + 0x48),
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_finish,&ciphertext);
  plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  basic_endec<cryptox::symmetric_algorithm<&EVP_bf_cfb64>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
  ::operator()((basic_endec<cryptox::symmetric_algorithm<&EVP_bf_cfb64>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
                *)(this + 0x68),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&plaintext);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x35);
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_002e3d40;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_188 = (long)ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  local_180 = symmetric_algorithm<&EVP_bf_cfb64>::ciphertext_size_for
                        ((long)(source->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(source->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start);
  local_178 = &local_180;
  local_108[0] = local_188 == local_180;
  local_100 = 0;
  sStack_f8.pi_ = (sp_counted_base *)0x0;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
  ;
  local_a8 = "";
  local_b8 = &local_170;
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_002e3e38;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_110 = &local_178;
  local_128.m_message.px._0_1_ = 0;
  local_128._0_8_ = &PTR__lazy_ostream_002e3e38;
  local_128.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_170 = (undefined1 *)&local_188;
  boost::test_tools::tt_detail::report_assertion
            (local_108,&local_f0,&local_b0,0x35,1,2,2,"ciphertext.size()",&local_d0,
             "Algorithm::ciphertext_size_for(source.size())",&local_128);
  boost::detail::shared_count::~shared_count(&sStack_f8);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x37);
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_002e3d40;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_188 = (long)plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  local_180 = (long)(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
  local_108[0] = local_188 == local_180;
  local_100 = 0;
  sStack_f8.pi_ = (sp_counted_base *)0x0;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
  ;
  local_a8 = "";
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_002e3e38;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = &local_170;
  local_178 = &local_180;
  local_128.m_message.px._0_1_ = 0;
  local_128._0_8_ = &PTR__lazy_ostream_002e3e38;
  local_128.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_110 = &local_178;
  local_170 = (undefined1 *)&local_188;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_f8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x3c);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_128,(equal_coll_impl *)&local_f0,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  local_c8 = 0;
  local_d0 = &PTR__lazy_ostream_002e3d40;
  local_c0 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = (undefined1 **)0x27c1e1;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/endec_pair_tester.hxx"
  ;
  local_98 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_128,&local_d0,&local_a0,0x3c,1,0xd,4,"source.begin()","source.end()",
             "plaintext.begin()","plaintext.end()");
  boost::detail::shared_count::~shared_count(&local_128.m_message.pn);
  if (plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void check_roundtrip(const Container& source) {
			buffer_type ciphertext;
			encryptor(source.begin(), source.end(),
			          std::back_inserter(ciphertext));

			buffer_type plaintext;
			decryptor(ciphertext.begin(), ciphertext.end(),
			          std::back_inserter(plaintext));

			BOOST_CHECK_EQUAL(
				ciphertext.size(),
				Algorithm::ciphertext_size_for(source.size())
			);

			BOOST_CHECK_EQUAL(plaintext.size(), source.size());

			BOOST_CHECK_EQUAL_COLLECTIONS(
				source.begin(), source.end(),
				plaintext.begin(), plaintext.end()
			);
		}